

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void messageOut(TidyMessageImpl *message)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  TidyReportLevel TVar4;
  TidyDocImpl *pTVar5;
  StreamOut *pSVar6;
  Bool BVar7;
  Bool BVar8;
  byte *pbVar9;
  bool bVar10;
  
  if (message == (TidyMessageImpl *)0x0) {
    return;
  }
  pTVar5 = message->tidyDoc;
  BVar8 = message->allowMessage;
  TVar4 = message->level;
  uVar1 = TVar4 - TidyInfo;
  switch(uVar1) {
  case 0:
    pTVar5->infoMessages = pTVar5->infoMessages + 1;
    break;
  case 1:
    pTVar5->warnings = pTVar5->warnings + 1;
    break;
  case 2:
    pTVar5->optionErrors = pTVar5->optionErrors + 1;
    break;
  case 3:
    pTVar5->accessErrors = pTVar5->accessErrors + 1;
    break;
  case 4:
    pTVar5->errors = pTVar5->errors + 1;
    break;
  case 5:
    pTVar5->docErrors = pTVar5->docErrors + 1;
    break;
  default:
    BVar8 = message->muted == no & BVar8;
    if (TVar4 < TidyDialogueSummary) goto LAB_0015107a;
    goto LAB_0015108d;
  }
  BVar8 = message->muted == no & BVar8;
LAB_0015107a:
  if ((pTVar5->config).value[0x49].v <= (ulong)pTVar5->errors) {
    BVar8 = no;
  }
LAB_0015108d:
  if ((*(int *)((pTVar5->config).value + 0x44) == 1) &&
     (BVar7 = no, bVar10 = BVar8 != no, BVar8 = BVar7, bVar10)) {
    uVar2 = message->code - 0x276;
    if (((uVar2 < 6) && ((0x25U >> (uVar2 & 0x1f) & 1) != 0)) ||
       ((uVar1 < 9 && ((0x105U >> (uVar1 & 0x1f) & 1) != 0)))) goto LAB_001510e0;
    if (TidyFatal < TVar4) {
      BVar8 = (Bool)(message->code == 0x21c);
      goto LAB_001510e0;
    }
    if (*(int *)((pTVar5->config).value + 0x4b) == 0) {
      BVar7 = no;
      if (TVar4 != TidyInfo) goto LAB_001510fb;
      goto LAB_00151105;
    }
    if (*(int *)((pTVar5->config).value + 0x4e) != 0) goto LAB_00151121;
LAB_00151113:
    BVar7 = (Bool)(TVar4 != TidyWarning);
  }
  else {
LAB_001510e0:
    BVar7 = BVar8;
    if (((*(int *)((pTVar5->config).value + 0x4b) == 0) && (BVar7 = no, TVar4 != TidyInfo)) &&
       (BVar8 != no)) {
LAB_001510fb:
      BVar7 = (uint)(TVar4 != TidyDialogueInfo);
    }
LAB_00151105:
    if (*(int *)((pTVar5->config).value + 0x4e) == 0) {
      if (BVar7 == no) goto LAB_00151171;
      goto LAB_00151113;
    }
  }
  if (BVar7 != no) {
LAB_00151121:
    pSVar6 = pTVar5->errout;
    pbVar9 = (byte *)message->messageOutput;
    do {
      bVar3 = *pbVar9;
      if (bVar3 == '\n') {
        prvTidyWriteChar(10,pTVar5->errout);
      }
      else {
        if (bVar3 == '\0') goto LAB_00151160;
        (*(pSVar6->sink).putByte)((pSVar6->sink).sinkData,bVar3);
      }
      pbVar9 = pbVar9 + 1;
    } while( true );
  }
LAB_00151171:
  prvTidytidyMessageRelease(message);
  return;
LAB_00151160:
  prvTidyWriteChar(10,pTVar5->errout);
  goto LAB_00151171;
}

Assistant:

static void messageOut( TidyMessageImpl *message )
{
    TidyDocImpl *doc;
    Bool go = yes;

    if ( !message )
        return;

    doc = message->tidyDoc;

    /* The filter has had a chance to suppress *any* message from output. */
    go = message->allowMessage;

    /* Update the count of each report type. */
    switch ( message->level )
    {
        case TidyInfo:
            doc->infoMessages++;
            break;
        case TidyWarning:
            doc->warnings++;
            break;
        case TidyConfig:
            doc->optionErrors++;
            break;
        case TidyAccess:
            doc->accessErrors++;
            break;
        case TidyError:
            doc->errors++;
            break;
        case TidyBadDocument:
            doc->docErrors++;
            break;
        case TidyFatal:
            /* Ack! */
            break;
        default:
            break;
    }

    /* Suppress report messages if they've been muted. */
    go = go & !message->muted;

    /* Suppress report messages if we've already reached the reporting limit. */
    if ( message->level <= TidyFatal )
    {
        go = go & ( doc->errors < cfg(doc, TidyShowErrors) );
    }

    /* Let TidyQuiet silence a lot of things. */
    if ( cfgBool( doc, TidyQuiet ) == yes )
    {
        go = go && message->code != STRING_DOCTYPE_GIVEN;
        go = go && message->code != STRING_CONTENT_LOOKS;
        go = go && message->code != STRING_NO_SYSID;
        go = go && message->level != TidyDialogueInfo;
        go = go && message->level != TidyConfig;
        go = go && message->level != TidyInfo;
        go = go && !(message->level >= TidyDialogueSummary &&
                            message->code != STRING_NEEDS_INTERVENTION);
    }

    /* Let !TidyShowInfo silence some things. */
    if ( cfgBool( doc, TidyShowInfo ) == no )
    {
        go = go && message->level != TidyInfo;

        /* Temporary; TidyShowInfo shouldn't affect TidyDialogueInfo, but
           right now such messages are hidden until we granularize the
           output controls. */
        go = go && message->level != TidyDialogueInfo;
    }

    /* Let !TidyShowWarnings silence some things. */
    if ( cfgBool( doc, TidyShowWarnings ) == no )
    {
        go = go && message->level != TidyWarning;
    }

    /* Output the message if applicable. */
    if ( go )
    {
        TidyOutputSink *outp = &doc->errout->sink;
        ctmbstr cp;
        byte b = '\0';
        for ( cp = message->messageOutput; *cp; ++cp )
        {
            b = (*cp & 0xff);
            if (b == (byte)'\n')
                TY_(WriteChar)( b, doc->errout );   /* for EOL translation */
            else
                outp->putByte( outp->sinkData, b ); /* #383 - no encoding */
        }

        /* Always add a trailing newline. Reports require this, and dialogue
           messages will be better spaced out without having to fill the
           language file with superflous newlines. */
        TY_(WriteChar)( '\n', doc->errout );
    }

    TY_(tidyMessageRelease)(message);
}